

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver2.c
# Opt level: O0

int solver2_analyze_final(sat_solver2 *s,clause *conf,int skip_first)

{
  int iVar1;
  int iVar2;
  lit e;
  int *piVar3;
  clause *cls;
  bool bVar4;
  clause *c;
  int x;
  int j;
  int i;
  int skip_first_local;
  clause *conf_local;
  sat_solver2 *s_local;
  
  veci_resize(&s->conf_final,0);
  if (s->root_level == 0) {
    s_local._4_4_ = s->hProofLast;
  }
  else {
    proof_chain_start(s,conf);
    iVar1 = veci_size(&s->tagged);
    x = skip_first;
    if (iVar1 != 0) {
      __assert_fail("veci_size(&s->tagged) == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver2.c"
                    ,0x271,"int solver2_analyze_final(sat_solver2 *, clause *, int)");
    }
    while( true ) {
      bVar4 = false;
      if (x < (int)((uint)*conf >> 0xb)) {
        c._0_4_ = lit_var((lit)conf[(long)x + 1]);
        bVar4 = (int)c != 0;
      }
      if (!bVar4) break;
      iVar1 = var_level(s,(int)c);
      if (iVar1 == 0) {
        proof_chain_resolve(s,(clause *)0x0,(int)c);
      }
      else {
        var_set_tag(s,(int)c,1);
      }
      x = x + 1;
    }
    iVar1 = s->root_level;
    iVar2 = veci_size(&s->trail_lim);
    if (iVar1 < iVar2) {
      __assert_fail("s->root_level >= veci_size(&s->trail_lim)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver2.c"
                    ,0x278,"int solver2_analyze_final(sat_solver2 *, clause *, int)");
    }
    x = s->qtail;
    while( true ) {
      x = x + -1;
      piVar3 = veci_begin(&s->trail_lim);
      if (x < *piVar3) break;
      c._0_4_ = lit_var(s->trail[x]);
      iVar1 = var_tag(s,(int)c);
      if (iVar1 != 0) {
        iVar1 = var_reason(s,(int)c);
        cls = clause2_read(s,iVar1);
        if (cls == (clause *)0x0) {
          iVar1 = var_level(s,(int)c);
          if (iVar1 == 0) {
            __assert_fail("var_level(s,x)",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver2.c"
                          ,0x287,"int solver2_analyze_final(sat_solver2 *, clause *, int)");
          }
          e = lit_neg(s->trail[x]);
          veci_push(&s->conf_final,e);
        }
        else {
          proof_chain_resolve(s,cls,(int)c);
          c._4_4_ = 1;
          while( true ) {
            bVar4 = false;
            if (c._4_4_ < (int)((uint)*cls >> 0xb)) {
              c._0_4_ = lit_var((lit)cls[(long)c._4_4_ + 1]);
              bVar4 = (int)c != 0;
            }
            if (!bVar4) break;
            iVar1 = var_level(s,(int)c);
            if (iVar1 == 0) {
              proof_chain_resolve(s,(clause *)0x0,(int)c);
            }
            else {
              var_set_tag(s,(int)c,1);
            }
            c._4_4_ = c._4_4_ + 1;
          }
        }
      }
    }
    solver2_clear_tags(s,0);
    s_local._4_4_ = proof_chain_stop(s);
  }
  return s_local._4_4_;
}

Assistant:

static int solver2_analyze_final(sat_solver2* s, clause* conf, int skip_first)
{
    int i, j, x;//, start;
    veci_resize(&s->conf_final,0);
    if ( s->root_level == 0 )
        return s->hProofLast;
    proof_chain_start( s, conf );
    assert( veci_size(&s->tagged) == 0 );
    clause_foreach_var( conf, x, i, skip_first ){
        if ( var_level(s,x) )
            var_set_tag(s, x, 1);
        else
            proof_chain_resolve( s, NULL, x );
    }
    assert( s->root_level >= veci_size(&s->trail_lim) );
//    start = (s->root_level >= veci_size(&s->trail_lim))? s->qtail-1 : (veci_begin(&s->trail_lim))[s->root_level];
    for (i = s->qtail-1; i >= (veci_begin(&s->trail_lim))[0]; i--){
        x = lit_var(s->trail[i]);
        if (var_tag(s,x)){
            clause* c = clause2_read(s, var_reason(s,x));
            if (c){
                proof_chain_resolve( s, c, x );
                clause_foreach_var( c, x, j, 1 ){
                    if ( var_level(s,x) )
                        var_set_tag(s, x, 1);
                    else
                        proof_chain_resolve( s, NULL, x );
                }
            }else {
                assert( var_level(s,x) );
                veci_push(&s->conf_final,lit_neg(s->trail[i]));
            }
        }
    }
    solver2_clear_tags(s,0);
    return proof_chain_stop( s );
}